

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

HRESULT Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::
        GenerateValidPointersMapHeader(LPCWSTR vpmFullPath)

{
  code *pcVar1;
  bool bVar2;
  errno_t eVar3;
  int iVar4;
  undefined4 *puVar5;
  char16 *header;
  PAL_FILE *file;
  LPCWSTR pWStack_10;
  HRESULT hr;
  LPCWSTR vpmFullPath_local;
  
  pWStack_10 = vpmFullPath;
  if (vpmFullPath == (LPCWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x194,"(vpmFullPath != nullptr)","vpmFullPath != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  file._4_4_ = -0x7fffbffb;
  header = (char16 *)0x0;
  eVar3 = _wfopen_unsafe((PAL_FILE **)&header,pWStack_10,L"w");
  if ((eVar3 == 0) && (header != (char16 *)0x0)) {
    iVar4 = PAL_fwprintf((PAL_FILE *)header,
                         L"//-------------------------------------------------------------------------------------------------------\n// Copyright (C) Microsoft. All rights reserved.\n// Licensed under the MIT license. See LICENSE.txt file in the project root for full license information.\n//-------------------------------------------------------------------------------------------------------\n// Generated via jshost -GenerateValidPointersMapHeader\n// Target platform: 64bit - amd64 & arm64\n#if USE_STATIC_VPM\n\n"
                        );
    if (-1 < iVar4) {
      file._4_4_ = GenerateValidPointersMapForBlockType((PAL_FILE *)header);
      if (-1 < file._4_4_) {
        file._4_4_ = ValidPointersMap<MediumAllocationBlockAttributes>::
                     GenerateValidPointersMapForBlockType((PAL_FILE *)header);
      }
      PAL_fwprintf((PAL_FILE *)header,L"#endif // USE_STATIC_VPM\n");
    }
    PAL_fclose((PAL_FILE *)header);
  }
  return file._4_4_;
}

Assistant:

HRESULT HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMapHeader(LPCWSTR vpmFullPath)
{
    Assert(vpmFullPath != nullptr);
    HRESULT hr = E_FAIL;
    FILE * file = nullptr;

    if (_wfopen_s(&file, vpmFullPath, _u("w")) == 0 && file != nullptr)
    {
        const char16 * header =
            _u("//-------------------------------------------------------------------------------------------------------\n")
            _u("// Copyright (C) Microsoft. All rights reserved.\n")
            _u("// Licensed under the MIT license. See LICENSE.txt file in the project root for full license information.\n")
            _u("//-------------------------------------------------------------------------------------------------------\n")
            _u("// Generated via jshost -GenerateValidPointersMapHeader\n")
#if defined(TARGET_32)
            _u("// Target platforms: 32bit - x86 & arm\n")
#elif defined(TARGET_64)
            _u("// Target platform: 64bit - amd64 & arm64\n")
#else
#error "Platform is not handled"
#endif
            _u("#if USE_STATIC_VPM\n")
            _u("\n");
        if (fwprintf(file, header) >= 0)
        {
            hr = ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(file);
            if (SUCCEEDED(hr))
            {
                hr = ValidPointersMap<MediumAllocationBlockAttributes>::GenerateValidPointersMapForBlockType(file);
            }

            fwprintf(file, _u("#endif // USE_STATIC_VPM\n"));
        }

        fclose(file);
    }

    return hr;
}